

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageColorReplaceCallback(gdImagePtr im,gdCallbackImageColor callback)

{
  int iVar1;
  bool bVar2;
  int color;
  int *src;
  long lVar3;
  int *dst;
  int iVar4;
  uint uVar5;
  int x;
  ulong uVar6;
  long lVar7;
  
  iVar4 = 0;
  if (callback != (gdCallbackImageColor)0x0) {
    if (im->trueColor == 0) {
      src = (int *)gdCalloc((long)im->colorsTotal,4);
      if (src == (int *)0x0) {
        iVar4 = -1;
      }
      else {
        if (im->colorsTotal < 1) {
          uVar5 = 0;
        }
        else {
          lVar3 = 0;
          uVar5 = 0;
          do {
            if (im->open[lVar3] == 0) {
              lVar7 = (long)(int)uVar5;
              uVar5 = uVar5 + 1;
              src[lVar7] = (int)lVar3;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < im->colorsTotal);
        }
        dst = (int *)gdCalloc((long)(int)uVar5,4);
        if (dst == (int *)0x0) {
          iVar4 = -1;
        }
        else {
          if ((int)uVar5 < 1) {
            uVar6 = 0;
          }
          else {
            uVar6 = 0;
            do {
              iVar4 = (*callback)(im,src[uVar6]);
              dst[uVar6] = iVar4;
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
          iVar4 = gdImageColorReplaceArray(im,(int)uVar6,src,dst);
          gdFree(dst);
        }
        gdFree(src);
      }
    }
    else {
      iVar4 = 0;
      if (im->cy1 <= im->cy2) {
        iVar4 = 0;
        lVar3 = (long)im->cy1;
        do {
          x = im->cx1;
          if (x <= im->cx2) {
            lVar7 = (long)x + -1;
            do {
              iVar1 = im->tpixels[lVar3][lVar7 + 1];
              color = (*callback)(im,iVar1);
              if (color != iVar1) {
                gdImageSetPixel(im,x,(int)lVar3,color);
                iVar4 = iVar4 + 1;
              }
              lVar7 = lVar7 + 1;
              x = x + 1;
            } while (lVar7 < im->cx2);
          }
          bVar2 = lVar3 < im->cy2;
          lVar3 = lVar3 + 1;
        } while (bVar2);
      }
    }
  }
  return iVar4;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceCallback (gdImagePtr im, gdCallbackImageColor callback)
{
	int c, d, n = 0;

	if (!callback) {
		return 0;
	}
	if (im->trueColor) {
		register int x, y;

		for (y = im->cy1; y <= im->cy2; y++) {
			for (x = im->cx1; x <= im->cx2; x++) {
				c = gdImageTrueColorPixel(im, x, y);
				if ( (d = callback(im, c)) != c) {
					gdImageSetPixel(im, x, y, d);
					n++;
				}
			}
		}
	} else { /* palette */
		int *sarr, *darr;
		int k, len = 0;

		sarr = (int *)gdCalloc(im->colorsTotal, sizeof(int));
		if (!sarr) {
			return -1;
		}
		for (c = 0; c < im->colorsTotal; c++) {
			if (!im->open[c]) {
				sarr[len++] = c;
			}
		}
		darr = (int *)gdCalloc(len, sizeof(int));
		if (!darr) {
			gdFree(sarr);
			return -1;
		}
		for (k = 0; k < len; k++) {
			darr[k] = callback(im, sarr[k]);
		}
		n = gdImageColorReplaceArray(im, k, sarr, darr);
		gdFree(darr);
		gdFree(sarr);
	}
	return n;
}